

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

RandSequenceStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::RandSequenceStatementSyntax,slang::syntax::NamedLabelSyntax*&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::ProductionSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,Token *args_3,
          Token *args_4,Token *args_5,SyntaxList<slang::syntax::ProductionSyntax> *args_6,
          Token *args_7)

{
  Token randsequence;
  Token openParen;
  Token firstProduction;
  Token closeParen;
  Token endsequence;
  RandSequenceStatementSyntax *this_00;
  
  this_00 = (RandSequenceStatementSyntax *)allocate(this,0xe0,8);
  randsequence.kind = args_2->kind;
  randsequence._2_1_ = args_2->field_0x2;
  randsequence.numFlags.raw = (args_2->numFlags).raw;
  randsequence.rawLen = args_2->rawLen;
  randsequence.info = args_2->info;
  endsequence.kind = args_7->kind;
  endsequence._2_1_ = args_7->field_0x2;
  endsequence.numFlags.raw = (args_7->numFlags).raw;
  endsequence.rawLen = args_7->rawLen;
  endsequence.info = args_7->info;
  closeParen.kind = args_5->kind;
  closeParen._2_1_ = args_5->field_0x2;
  closeParen.numFlags.raw = (args_5->numFlags).raw;
  closeParen.rawLen = args_5->rawLen;
  closeParen.info = args_5->info;
  firstProduction.kind = args_4->kind;
  firstProduction._2_1_ = args_4->field_0x2;
  firstProduction.numFlags.raw = (args_4->numFlags).raw;
  firstProduction.rawLen = args_4->rawLen;
  firstProduction.info = args_4->info;
  openParen.kind = args_3->kind;
  openParen._2_1_ = args_3->field_0x2;
  openParen.numFlags.raw = (args_3->numFlags).raw;
  openParen.rawLen = args_3->rawLen;
  openParen.info = args_3->info;
  slang::syntax::RandSequenceStatementSyntax::RandSequenceStatementSyntax
            (this_00,*args,args_1,randsequence,openParen,firstProduction,closeParen,args_6,
             endsequence);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }